

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

int __thiscall QFileSystemModelPrivate::init(QFileSystemModelPrivate *this,EVP_PKEY_CTX *ctx)

{
  QFileSystemModel *signal;
  long in_FS_OFFSET;
  QFileSystemModel *q;
  ContextType *in_stack_ffffffffffffff18;
  Connection *this_00;
  Object *in_stack_ffffffffffffff20;
  Object *in_stack_ffffffffffffff28;
  Object *in_stack_ffffffffffffff30;
  code *sender;
  Function in_stack_ffffffffffffff50;
  Function slot;
  offset_in_QFileInfoGatherer_to_subr in_stack_ffffffffffffff60;
  offset_in_QTimer_to_subr signal_00;
  Connection local_70 [8];
  code *local_68;
  undefined8 local_60;
  Connection local_58 [8];
  code *local_50;
  undefined8 uStack_48;
  Connection local_40 [8];
  code *local_38;
  undefined8 uStack_30;
  Connection local_28 [8];
  code *local_20;
  undefined8 uStack_18;
  Connection local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QTimer::setSingleShot((bool)((char)this + -0x18));
  qRegisterMetaType<QList<std::pair<QString,QFileInfo>>>();
  std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::get
            ((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)0xaa2e02);
  local_20 = directoryChanged;
  uStack_18 = 0;
  QObjectPrivate::
  connect<void(QFileInfoGatherer::*)(QString_const&,QList<QString>const&)const,void(QFileSystemModelPrivate::*)(QString_const&,QList<QString>const&)>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff60,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff50,(ConnectionType)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  QMetaObject::Connection::~Connection(local_10);
  std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::get
            ((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)0xaa2e8c);
  signal_00 = 0;
  local_38 = fileSystemChanged;
  uStack_30 = 0;
  QObjectPrivate::
  connect<void(QFileInfoGatherer::*)(QString_const&,QList<std::pair<QString,QFileInfo>>const&),void(QFileSystemModelPrivate::*)(QString_const&,QList<std::pair<QString,QFileInfo>>const&)>
            (in_stack_ffffffffffffff30,0,in_stack_ffffffffffffff28,in_stack_ffffffffffffff50,
             (ConnectionType)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  QMetaObject::Connection::~Connection(local_28);
  std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::get
            ((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)0xaa2f13);
  slot = 0;
  local_50 = resolvedName;
  uStack_48 = 0;
  QObjectPrivate::
  connect<void(QFileInfoGatherer::*)(QString_const&,QString_const&)const,void(QFileSystemModelPrivate::*)(QString_const&,QString_const&)>
            (in_stack_ffffffffffffff30,signal_00,in_stack_ffffffffffffff28,0,
             (ConnectionType)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  QMetaObject::Connection::~Connection(local_40);
  signal = q_func(this);
  std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::get
            ((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)0xaa2fa9);
  local_68 = QFileSystemModel::directoryLoaded;
  local_60 = 0;
  sender = QFileInfoGatherer::directoryLoaded;
  QObject::
  connect<void(QFileInfoGatherer::*)(QString_const&),void(QFileSystemModel::*)(QString_const&)>
            (in_stack_ffffffffffffff20,(offset_in_QFileInfoGatherer_to_subr)signal,
             in_stack_ffffffffffffff18,(offset_in_QFileSystemModel_to_subr *)this,
             (ConnectionType)signal_00);
  QMetaObject::Connection::~Connection(local_58);
  this_00 = local_70;
  QObjectPrivate::
  connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QFileSystemModelPrivate::*)()>
            ((Object *)sender,signal_00,(Object *)0x0,slot,AutoConnection);
  QMetaObject::Connection::~Connection(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::init()
{
    delayedSortTimer.setSingleShot(true);

    qRegisterMetaType<QList<std::pair<QString, QFileInfo>>>();
#if QT_CONFIG(filesystemwatcher)
    QObjectPrivate::connect(fileInfoGatherer.get(), &QFileInfoGatherer::newListOfFiles,
                            this, &QFileSystemModelPrivate::directoryChanged);
    QObjectPrivate::connect(fileInfoGatherer.get(), &QFileInfoGatherer::updates,
                            this, &QFileSystemModelPrivate::fileSystemChanged);
    QObjectPrivate::connect(fileInfoGatherer.get(), &QFileInfoGatherer::nameResolved,
                            this, &QFileSystemModelPrivate::resolvedName);
    Q_Q(QFileSystemModel);
    q->connect(fileInfoGatherer.get(), &QFileInfoGatherer::directoryLoaded,
               q, &QFileSystemModel::directoryLoaded);
#endif // filesystemwatcher
    QObjectPrivate::connect(&delayedSortTimer, &QTimer::timeout,
                            this, &QFileSystemModelPrivate::performDelayedSort,
                            Qt::QueuedConnection);
}